

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

void __thiscall PDFObjectParser::PDFObjectParser(PDFObjectParser *this)

{
  PDFObjectParser *this_local;
  
  PDFParserTokenizer::PDFParserTokenizer(&this->mTokenizer);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->mTokenBuffer);
  this->mParserExtender = (IPDFParserExtender *)0x0;
  this->mDecryptionHelper = (DecryptionHelper *)0x0;
  this->mOwnsStream = false;
  this->mStream = (IByteReader *)0x0;
  this->mDepth = 0;
  return;
}

Assistant:

PDFObjectParser::PDFObjectParser(void)
{
	mParserExtender = NULL;
	mDecryptionHelper = NULL;
	mOwnsStream = false;
	mStream = NULL;
	mDepth = 0;
}